

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

ON_wString __thiscall
ON_wString::FormatToVulgarFraction(ON_wString *this,ON_wString *numerator,ON_wString *denominator)

{
  ON_wString local_60;
  ON_wString local_58;
  ON_wString local_50 [3];
  ON_wString local_38;
  ON_wString local_30;
  ON_wString local_28;
  ON_wString *local_20;
  ON_wString *denominator_local;
  ON_wString *numerator_local;
  
  local_20 = denominator;
  denominator_local = numerator;
  numerator_local = this;
  ON_wString(&local_38,numerator);
  FormatToVulgarFractionNumerator(&local_30,&local_38);
  VulgarFractionSlash();
  operator+(&local_28,&local_30);
  ON_wString(&local_60,denominator);
  FormatToVulgarFractionDenominator(&local_58,&local_60);
  operator+(this,&local_28);
  ~ON_wString(&local_58);
  ~ON_wString(&local_60);
  ~ON_wString(&local_28);
  ~ON_wString(local_50);
  ~ON_wString(&local_30);
  ~ON_wString(&local_38);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_wString::FormatToVulgarFraction(
  const ON_wString numerator,
  const ON_wString denominator
)
{
  return ON_wString::FormatToVulgarFractionNumerator(numerator) + ON_wString::VulgarFractionSlash() + ON_wString::FormatToVulgarFractionDenominator(denominator);
}